

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

int glad_gl_find_extensions_gl(int version)

{
  int iVar1;
  char **local_28;
  char **exts_i;
  char *pcStack_18;
  uint num_exts_i;
  char *exts;
  int version_local;
  
  pcStack_18 = (char *)0x0;
  exts_i._4_4_ = 0;
  local_28 = (char **)0x0;
  exts._0_4_ = version;
  iVar1 = glad_gl_get_extensions
                    (version,&stack0xffffffffffffffe8,(uint *)((long)&exts_i + 4),&local_28);
  if (iVar1 != 0) {
    GLAD_GL_ARB_multisample =
         glad_gl_has_extension((int)exts,pcStack_18,exts_i._4_4_,local_28,"GL_ARB_multisample");
    GLAD_GL_ARB_robustness =
         glad_gl_has_extension((int)exts,pcStack_18,exts_i._4_4_,local_28,"GL_ARB_robustness");
    GLAD_GL_KHR_debug =
         glad_gl_has_extension((int)exts,pcStack_18,exts_i._4_4_,local_28,"GL_KHR_debug");
    glad_gl_free_extensions(local_28,exts_i._4_4_);
  }
  exts._4_4_ = (uint)(iVar1 != 0);
  return exts._4_4_;
}

Assistant:

static int glad_gl_find_extensions_gl( int version) {
    const char *exts = NULL;
    unsigned int num_exts_i = 0;
    char **exts_i = NULL;
    if (!glad_gl_get_extensions(version, &exts, &num_exts_i, &exts_i)) return 0;

    GLAD_GL_ARB_multisample = glad_gl_has_extension(version, exts, num_exts_i, exts_i, "GL_ARB_multisample");
    GLAD_GL_ARB_robustness = glad_gl_has_extension(version, exts, num_exts_i, exts_i, "GL_ARB_robustness");
    GLAD_GL_KHR_debug = glad_gl_has_extension(version, exts, num_exts_i, exts_i, "GL_KHR_debug");

    glad_gl_free_extensions(exts_i, num_exts_i);

    return 1;
}